

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O0

void __thiscall
pbrt::RGBFilm::AddSample
          (RGBFilm *this,Point2i *pFilm,SampledSpectrum L,SampledWavelengths *lambda,
          VisibleSurface *param_5,Float weight)

{
  undefined8 uVar1;
  undefined8 uVar2;
  initializer_list<float> __l;
  Pixel *pPVar3;
  Float *pFVar4;
  PixelSensor *in_RCX;
  Tuple2<pbrt::Point2,_int> *in_RSI;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [64];
  float in_XMM2_Da;
  RGB RVar10;
  SampledSpectrum SVar11;
  int c;
  Pixel *pixel;
  Float m;
  RGB rgb;
  SampledSpectrum H;
  undefined4 in_stack_ffffffffffffff48;
  Float in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int c_00;
  Float local_84;
  Float local_80;
  Float local_7c;
  Float *local_78;
  undefined8 local_70;
  float local_64;
  RGB local_60;
  RGB local_50;
  undefined4 local_44;
  float fVar12;
  undefined1 auVar7 [56];
  undefined1 auVar9 [56];
  
  auVar9 = in_ZMM1._8_56_;
  vmovlpd_avx(in_ZMM0._0_16_);
  vmovlpd_avx(in_ZMM1._0_16_);
  PixelSensor::ImagingRatio(*(PixelSensor **)(in_RDI + 0x28));
  auVar7 = extraout_var;
  SVar11 = SampledSpectrum::operator*
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      in_stack_ffffffffffffff4c);
  auVar8._0_8_ = SVar11.values.values._8_8_;
  auVar8._8_56_ = auVar9;
  auVar5._0_8_ = SVar11.values.values._0_8_;
  auVar5._8_56_ = auVar7;
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  local_44 = (undefined4)uVar1;
  uVar2 = vmovlpd_avx(auVar8._0_16_);
  RVar10 = PixelSensor::ToSensorRGB
                     (in_RCX,(SampledSpectrum *)CONCAT44(in_XMM2_Da,(int)((ulong)uVar2 >> 0x20)),
                      (SampledWavelengths *)CONCAT44((int)uVar2,(int)((ulong)uVar1 >> 0x20)));
  local_7c = RVar10.b;
  auVar6._0_8_ = RVar10._0_8_;
  auVar6._8_56_ = auVar7;
  local_60._0_8_ = vmovlpd_avx(auVar6._0_16_);
  local_50.r = local_60.r;
  local_84 = local_50.r;
  local_50.g = local_60.g;
  local_80 = local_50.g;
  local_78 = &local_84;
  local_70 = 3;
  __l._M_array._4_4_ = in_stack_ffffffffffffff4c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff48;
  __l._M_len._0_4_ = in_stack_ffffffffffffff50;
  __l._M_len._4_4_ = in_stack_ffffffffffffff54;
  local_60.b = local_7c;
  local_50._0_8_ = local_60._0_8_;
  local_50.b = local_7c;
  local_64 = std::max<float>(__l);
  if (*(float *)(in_RDI + 0x58) < local_64) {
    SampledSpectrum::operator*=
              ((SampledSpectrum *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (Float)((ulong)in_RDI >> 0x20));
    RGB::operator*=(&local_50,*(float *)(in_RDI + 0x58) / local_64);
  }
  pPVar3 = Array2D<pbrt::RGBFilm::Pixel>::operator[]
                     ((Array2D<pbrt::RGBFilm::Pixel> *)(in_RDI + 0x88),(Point2i)*in_RSI);
  for (c_00 = 0; c_00 < 3; c_00 = c_00 + 1) {
    fVar12 = in_XMM2_Da;
    pFVar4 = RGB::operator[](&local_50,c_00);
    pPVar3->rgbSum[c_00] = (double)(in_XMM2_Da * *pFVar4) + pPVar3->rgbSum[c_00];
    in_XMM2_Da = fVar12;
  }
  pPVar3->weightSum = (double)in_XMM2_Da + pPVar3->weightSum;
  return;
}

Assistant:

PBRT_CPU_GPU
    void AddSample(const Point2i &pFilm, SampledSpectrum L,
                   const SampledWavelengths &lambda, const VisibleSurface *,
                   Float weight) {
        // Convert sample radiance to _PixelSensor_ RGB
        SampledSpectrum H = L * sensor->ImagingRatio();
        RGB rgb = sensor->ToSensorRGB(H, lambda);

        // Optionally clamp sensor RGB value
        Float m = std::max({rgb.r, rgb.g, rgb.b});
        if (m > maxComponentValue) {
            H *= maxComponentValue / m;
            rgb *= maxComponentValue / m;
        }

        DCHECK(InsideExclusive(pFilm, pixelBounds));
        // Update pixel values with filtered sample contribution
        Pixel &pixel = pixels[pFilm];
        for (int c = 0; c < 3; ++c)
            pixel.rgbSum[c] += weight * rgb[c];
        pixel.weightSum += weight;
    }